

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONNode.cpp
# Opt level: O2

void __thiscall JSONNode::JSONNode(JSONNode *this,json_string *name_t,char *value_t)

{
  internalJSONNode *this_00;
  allocator local_41;
  json_string local_40;
  
  this_00 = internalJSONNode::newInternal('\0');
  this->internal = this_00;
  std::__cxx11::string::string((string *)&local_40,value_t,&local_41);
  internalJSONNode::Set(this_00,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  internalJSONNode::setname(this->internal,name_t);
  return;
}

Assistant:

JSONNode::JSONNode(const json_string & name_t, const json_char * value_t) json_nothrow : internal(internalJSONNode::newInternal()){
	   internal -> Set(json_string(value_t));
	   internal -> setname(name_t);
	   LIBJSON_CTOR;
    }